

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertpng.c
# Opt level: O0

opj_image_t * pngtoimage(char *read_idf,opj_cparameters_t *params)

{
  byte bVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  __jmp_buf_tag *__env;
  void *pvVar4;
  undefined8 uVar5;
  OPJ_INT32 *local_148;
  OPJ_INT32 *planes [4];
  convert_32s_CXPX cvtCxToPx;
  convert_XXx32s_C1R cvtXXTo32s;
  OPJ_BYTE sigbuf [8];
  OPJ_UINT32 nr_comp;
  opj_image_cmptparm_t cmptparm [4];
  opj_image_t *image;
  OPJ_INT32 *row32s;
  OPJ_BYTE **rows;
  FILE *reader;
  int color_type;
  png_uint_32 height;
  png_uint_32 width;
  OPJ_UINT32 i;
  int filter_type;
  int compression_type;
  int interlace_type;
  int bit_depth;
  double gamma;
  png_infop info;
  png_structp png;
  opj_cparameters_t *params_local;
  char *read_idf_local;
  
  info = (png_infop)0x0;
  gamma = 0.0;
  reader._4_4_ = 0;
  row32s = (OPJ_INT32 *)0x0;
  image = (opj_image_t *)0x0;
  cmptparm[3].bpp = 0;
  cmptparm[3].sgnd = 0;
  planes[3] = (OPJ_INT32 *)0x0;
  png = (png_structp)params;
  params_local = (opj_cparameters_t *)read_idf;
  __stream = fopen(read_idf,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"pngtoimage: can not open %s\n",params_local);
    return (opj_image_t *)0x0;
  }
  sVar3 = fread((void *)((long)&cvtXXTo32s + 4),1,8,__stream);
  if ((sVar3 == 8) && (stack0xfffffffffffffeec == 0xa1a0a0d474e5089)) {
    info = (png_infop)png_create_read_struct("1.6.37",0,0);
    if ((info != (png_infop)0x0) && (gamma = (double)png_create_info_struct(info), gamma != 0.0)) {
      __env = (__jmp_buf_tag *)png_set_longjmp_fn(info,longjmp,200);
      iVar2 = _setjmp(__env);
      if (iVar2 == 0) {
        png_init_io(info,__stream);
        png_set_sig_bytes(info,8);
        png_read_info(info,gamma);
        iVar2 = png_get_IHDR(info,gamma,&color_type,(long)&reader + 4,&compression_type,&reader,
                             &filter_type,&i,&width);
        if (iVar2 != 0) {
          if ((uint)reader == 3) {
            png_set_expand(info);
          }
          iVar2 = png_get_valid(info,gamma,0x10);
          if (iVar2 != 0) {
            png_set_expand(info);
          }
          iVar2 = png_get_gAMA(info,gamma,&interlace_type);
          if (iVar2 == 0) {
            _interlace_type = 0x3ff0000000000000;
          }
          png_set_gamma(0x3ff0000000000000,_interlace_type,info);
          png_read_update_info(info,gamma);
          bVar1 = png_get_color_type(info,gamma);
          reader._0_4_ = (uint)bVar1;
          switch((uint)reader) {
          case 0:
            sigbuf[0] = '\x01';
            sigbuf[1] = '\0';
            sigbuf[2] = '\0';
            sigbuf[3] = '\0';
            break;
          default:
            fprintf(_stderr,"pngtoimage: colortype %d is not supported\n",(ulong)(uint)reader);
            goto LAB_0011c326;
          case 2:
            sigbuf[0] = '\x03';
            sigbuf[1] = '\0';
            sigbuf[2] = '\0';
            sigbuf[3] = '\0';
            break;
          case 4:
            sigbuf[0] = '\x02';
            sigbuf[1] = '\0';
            sigbuf[2] = '\0';
            sigbuf[3] = '\0';
            break;
          case 6:
            sigbuf[0] = '\x04';
            sigbuf[1] = '\0';
            sigbuf[2] = '\0';
            sigbuf[3] = '\0';
          }
          planes[3] = (OPJ_INT32 *)convert_32s_CXPX_LUT[(uint)sigbuf._0_4_];
          bVar1 = png_get_bit_depth(info,gamma);
          compression_type = (int)bVar1;
          if (((compression_type - 1U < 2) || (compression_type == 4)) || (compression_type == 8)) {
            cvtCxToPx = (convert_32s_CXPX)convert_XXu32s_C1R_LUT[compression_type];
          }
          else {
            if (compression_type != 0x10) {
              fprintf(_stderr,"pngtoimage: bit depth %d is not supported\n",
                      (ulong)(uint)compression_type);
              goto LAB_0011c326;
            }
            cvtCxToPx = convert_16u32s_C1R;
          }
          row32s = (OPJ_INT32 *)calloc((ulong)(reader._4_4_ + 1),8);
          if (row32s == (OPJ_INT32 *)0x0) {
            fprintf(_stderr,"pngtoimage: memory out\n");
          }
          else {
            for (height = 0; height < reader._4_4_; height = height + 1) {
              sVar3 = png_get_rowbytes(info,gamma);
              pvVar4 = malloc(sVar3);
              *(void **)(row32s + (ulong)height * 2) = pvVar4;
              if (*(long *)(row32s + (ulong)height * 2) == 0) {
                fprintf(_stderr,"pngtoimage: memory out\n");
                goto LAB_0011c326;
              }
            }
            png_read_image(info);
            memset(sigbuf + 4,0,0x90);
            for (height = 0; height < (uint)sigbuf._0_4_; height = height + 1) {
              cmptparm[height].x0 = compression_type;
              cmptparm[height].y0 = compression_type;
              cmptparm[height].prec = 0;
              *(undefined4 *)(sigbuf + (ulong)height * 0x24 + 4) = *(undefined4 *)(png + 0x4714);
              cmptparm[(ulong)height - 1].sgnd = *(OPJ_UINT32 *)(png + 0x4718);
              cmptparm[height].dx = color_type;
              cmptparm[height].dy = reader._4_4_;
            }
            uVar5 = 2;
            if (2 < (uint)sigbuf._0_4_) {
              uVar5 = 1;
            }
            cmptparm[3]._28_8_ = opj_image_create(sigbuf._0_4_,sigbuf + 4,uVar5);
            if ((int *)cmptparm[3]._28_8_ != (int *)0x0) {
              *(int *)cmptparm[3]._28_8_ = *(int *)(png + 0x470c);
              *(int *)(cmptparm[3]._28_8_ + 4) = *(int *)(png + 0x4710);
              *(int *)(cmptparm[3]._28_8_ + 8) =
                   *(int *)cmptparm[3]._28_8_ + (color_type + -1) * *(int *)(png + 0x4714) + 1 +
                   *(int *)cmptparm[3]._28_8_;
              *(OPJ_UINT32 *)(cmptparm[3]._28_8_ + 0xc) =
                   *(int *)(cmptparm[3]._28_8_ + 4) + (reader._4_4_ - 1) * *(int *)(png + 0x4718) +
                   1 + *(int *)(cmptparm[3]._28_8_ + 4);
              image = (opj_image_t *)malloc((ulong)(uint)color_type * (ulong)(uint)sigbuf._0_4_ * 4)
              ;
              if (image != (opj_image_t *)0x0) {
                *(ushort *)
                 (*(long *)(cmptparm[3]._28_8_ + 0x18) + (ulong)(sigbuf._0_4_ - 1) * 0x40 + 0x38) =
                     1 - ((ushort)sigbuf._0_4_ & 1);
                for (height = 0; height < (uint)sigbuf._0_4_; height = height + 1) {
                  planes[(ulong)height - 1] =
                       *(OPJ_INT32 **)
                        (*(long *)(cmptparm[3]._28_8_ + 0x18) + (ulong)height * 0x40 + 0x30);
                }
                for (height = 0; height < reader._4_4_; height = height + 1) {
                  (*cvtCxToPx)(*(OPJ_INT32 **)(row32s + (ulong)height * 2),(OPJ_INT32 **)image,
                               (ulong)(uint)color_type * (ulong)(uint)sigbuf._0_4_);
                  (*(code *)planes[3])(image,&local_148,color_type);
                  local_148 = local_148 + (uint)color_type;
                  planes[0] = planes[0] + (uint)color_type;
                  planes[1] = planes[1] + (uint)color_type;
                  planes[2] = planes[2] + (uint)color_type;
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    fprintf(_stderr,"pngtoimage: %s is no valid PNG file\n",params_local);
  }
LAB_0011c326:
  if (row32s != (OPJ_INT32 *)0x0) {
    for (height = 0; height < reader._4_4_; height = height + 1) {
      if (*(long *)(row32s + (ulong)height * 2) != 0) {
        free(*(void **)(row32s + (ulong)height * 2));
      }
    }
    free(row32s);
  }
  if (image != (opj_image_t *)0x0) {
    free(image);
  }
  if (info != (png_infop)0x0) {
    png_destroy_read_struct(&info,&gamma,0);
  }
  fclose(__stream);
  return (opj_image_t *)cmptparm[3]._28_8_;
}

Assistant:

opj_image_t *pngtoimage(const char *read_idf, opj_cparameters_t * params)
{
    png_structp  png = NULL;
    png_infop    info = NULL;
    double gamma;
    int bit_depth, interlace_type, compression_type, filter_type;
    OPJ_UINT32 i;
    png_uint_32  width, height = 0U;
    int color_type;
    FILE *reader = NULL;
    OPJ_BYTE** rows = NULL;
    OPJ_INT32* row32s = NULL;
    /* j2k: */
    opj_image_t *image = NULL;
    opj_image_cmptparm_t cmptparm[4];
    OPJ_UINT32 nr_comp;
    OPJ_BYTE sigbuf[8];
    convert_XXx32s_C1R cvtXXTo32s = NULL;
    convert_32s_CXPX cvtCxToPx = NULL;
    OPJ_INT32* planes[4];

    if ((reader = fopen(read_idf, "rb")) == NULL) {
        fprintf(stderr, "pngtoimage: can not open %s\n", read_idf);
        return NULL;
    }

    if (fread(sigbuf, 1, MAGIC_SIZE, reader) != MAGIC_SIZE
            || memcmp(sigbuf, PNG_MAGIC, MAGIC_SIZE) != 0) {
        fprintf(stderr, "pngtoimage: %s is no valid PNG file\n", read_idf);
        goto fin;
    }

    if ((png = png_create_read_struct(PNG_LIBPNG_VER_STRING,
                                      NULL, NULL, NULL)) == NULL) {
        goto fin;
    }
    if ((info = png_create_info_struct(png)) == NULL) {
        goto fin;
    }

    if (setjmp(png_jmpbuf(png))) {
        goto fin;
    }

    png_init_io(png, reader);
    png_set_sig_bytes(png, MAGIC_SIZE);

    png_read_info(png, info);

    if (png_get_IHDR(png, info, &width, &height,
                     &bit_depth, &color_type, &interlace_type,
                     &compression_type, &filter_type) == 0) {
        goto fin;
    }

    /* png_set_expand():
     * expand paletted images to RGB, expand grayscale images of
     * less than 8-bit depth to 8-bit depth, and expand tRNS chunks
     * to alpha channels.
     */
    if (color_type == PNG_COLOR_TYPE_PALETTE) {
        png_set_expand(png);
    }

    if (png_get_valid(png, info, PNG_INFO_tRNS)) {
        png_set_expand(png);
    }
    /* We might wan't to expand background */
    /*
    if(png_get_valid(png, info, PNG_INFO_bKGD)) {
        png_color_16p bgnd;
        png_get_bKGD(png, info, &bgnd);
        png_set_background(png, bgnd, PNG_BACKGROUND_GAMMA_FILE, 1, 1.0);
    }
    */

    if (!png_get_gAMA(png, info, &gamma)) {
        gamma = 1.0;
    }

    /* we're not displaying but converting, screen gamma == 1.0 */
    png_set_gamma(png, 1.0, gamma);

    png_read_update_info(png, info);

    color_type = png_get_color_type(png, info);

    switch (color_type) {
    case PNG_COLOR_TYPE_GRAY:
        nr_comp = 1;
        break;
    case PNG_COLOR_TYPE_GRAY_ALPHA:
        nr_comp = 2;
        break;
    case PNG_COLOR_TYPE_RGB:
        nr_comp = 3;
        break;
    case PNG_COLOR_TYPE_RGB_ALPHA:
        nr_comp = 4;
        break;
    default:
        fprintf(stderr, "pngtoimage: colortype %d is not supported\n", color_type);
        goto fin;
    }
    cvtCxToPx = convert_32s_CXPX_LUT[nr_comp];
    bit_depth = png_get_bit_depth(png, info);

    switch (bit_depth) {
    case 1:
    case 2:
    case 4:
    case 8:
        cvtXXTo32s = convert_XXu32s_C1R_LUT[bit_depth];
        break;
    case 16: /* 16 bpp is specific to PNG */
        cvtXXTo32s = convert_16u32s_C1R;
        break;
    default:
        fprintf(stderr, "pngtoimage: bit depth %d is not supported\n", bit_depth);
        goto fin;
    }


    rows = (OPJ_BYTE**)calloc(height + 1, sizeof(OPJ_BYTE*));
    if (rows == NULL) {
        fprintf(stderr, "pngtoimage: memory out\n");
        goto fin;
    }
    for (i = 0; i < height; ++i) {
        rows[i] = (OPJ_BYTE*)malloc(png_get_rowbytes(png, info));
        if (rows[i] == NULL) {
            fprintf(stderr, "pngtoimage: memory out\n");
            goto fin;
        }
    }
    png_read_image(png, rows);

    /* Create image */
    memset(cmptparm, 0, sizeof(cmptparm));
    for (i = 0; i < nr_comp; ++i) {
        cmptparm[i].prec = (OPJ_UINT32)bit_depth;
        /* bits_per_pixel: 8 or 16 */
        cmptparm[i].bpp = (OPJ_UINT32)bit_depth;
        cmptparm[i].sgnd = 0;
        cmptparm[i].dx = (OPJ_UINT32)params->subsampling_dx;
        cmptparm[i].dy = (OPJ_UINT32)params->subsampling_dy;
        cmptparm[i].w = (OPJ_UINT32)width;
        cmptparm[i].h = (OPJ_UINT32)height;
    }

    image = opj_image_create(nr_comp, &cmptparm[0],
                             (nr_comp > 2U) ? OPJ_CLRSPC_SRGB : OPJ_CLRSPC_GRAY);
    if (image == NULL) {
        goto fin;
    }
    image->x0 = (OPJ_UINT32)params->image_offset_x0;
    image->y0 = (OPJ_UINT32)params->image_offset_y0;
    image->x1 = (OPJ_UINT32)(image->x0 + (width  - 1) * (OPJ_UINT32)
                             params->subsampling_dx + 1 + image->x0);
    image->y1 = (OPJ_UINT32)(image->y0 + (height - 1) * (OPJ_UINT32)
                             params->subsampling_dy + 1 + image->y0);

    row32s = (OPJ_INT32 *)malloc((size_t)width * nr_comp * sizeof(OPJ_INT32));
    if (row32s == NULL) {
        goto fin;
    }

    /* Set alpha channel */
    image->comps[nr_comp - 1U].alpha = 1U - (nr_comp & 1U);

    for (i = 0; i < nr_comp; i++) {
        planes[i] = image->comps[i].data;
    }

    for (i = 0; i < height; ++i) {
        cvtXXTo32s(rows[i], row32s, (OPJ_SIZE_T)width * nr_comp);
        cvtCxToPx(row32s, planes, width);
        planes[0] += width;
        planes[1] += width;
        planes[2] += width;
        planes[3] += width;
    }
fin:
    if (rows) {
        for (i = 0; i < height; ++i)
            if (rows[i]) {
                free(rows[i]);
            }
        free(rows);
    }
    if (row32s) {
        free(row32s);
    }
    if (png) {
        png_destroy_read_struct(&png, &info, NULL);
    }

    fclose(reader);

    return image;

}